

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O3

string * __thiscall
antlr::Parser::getFilename_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  ParserInputState *pPVar1;
  pointer pcVar2;
  
  pPVar1 = ((this->inputState).ref)->ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pPVar1->filename)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pPVar1->filename)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string getFilename() const
	{
		return inputState->filename;
	}